

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnFunction(BinaryReaderIR *this,Index index,Index sig_index)

{
  char *pcVar1;
  Offset OVar2;
  size_t sVar3;
  tuple<wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_> tVar4;
  Location loc;
  __uniq_ptr_impl<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_> local_a0;
  Location local_98;
  Var local_78;
  
  pcVar1 = this->filename_;
  sVar3 = strlen(pcVar1);
  OVar2 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  tVar4.super__Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>
  .super__Head_base<0UL,_wabt::FuncModuleField_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>)
       operator_new(0x148);
  *(long *)((long)tVar4.
                  super__Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>
                  .super__Head_base<0UL,_wabt::FuncModuleField_*,_false>._M_head_impl + 8) = 0;
  *(long *)((long)tVar4.
                  super__Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>
                  .super__Head_base<0UL,_wabt::FuncModuleField_*,_false>._M_head_impl + 0x10) = 0;
  *(char **)((long)tVar4.
                   super__Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>
                   .super__Head_base<0UL,_wabt::FuncModuleField_*,_false>._M_head_impl + 0x18) =
       pcVar1;
  *(size_t *)
   ((long)tVar4.
          super__Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>
          .super__Head_base<0UL,_wabt::FuncModuleField_*,_false>._M_head_impl + 0x20) = sVar3;
  *(Offset *)
   ((long)tVar4.
          super__Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>
          .super__Head_base<0UL,_wabt::FuncModuleField_*,_false>._M_head_impl + 0x28) = OVar2;
  *(long *)((long)tVar4.
                  super__Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>
                  .super__Head_base<0UL,_wabt::FuncModuleField_*,_false>._M_head_impl + 0x30) = 0;
  *(undefined4 *)
   ((long)tVar4.
          super__Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>
          .super__Head_base<0UL,_wabt::FuncModuleField_*,_false>._M_head_impl + 0x38) = 0;
  *(undefined ***)
   tVar4.
   super__Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>.
   super__Head_base<0UL,_wabt::FuncModuleField_*,_false>._M_head_impl =
       &PTR__FuncModuleField_002d7a68;
  Func::Func((Func *)((long)tVar4.
                            super__Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>
                            .super__Head_base<0UL,_wabt::FuncModuleField_*,_false>._M_head_impl +
                     0x40),(string_view)ZEXT816(0));
  local_98.field_1.field_0.line = 0;
  local_98.field_1.field_0.first_column = 0;
  local_98.field_1.field_0.last_column = 0;
  local_98.filename.data_ = (char *)0x0;
  local_98.filename.size_._0_4_ = 0;
  local_98.filename.size_._4_4_ = 0;
  pcVar1 = this->filename_;
  sVar3 = strlen(pcVar1);
  local_98.filename.size_._0_4_ = (undefined4)sVar3;
  local_98.filename.size_._4_4_ = (undefined4)(sVar3 >> 0x20);
  OVar2 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_98.field_1.field_0.line = (int)OVar2;
  local_98.field_1.field_0.first_column = (int)(OVar2 >> 0x20);
  local_98.filename.data_ = pcVar1;
  Var::Var(&local_78,sig_index,&local_98);
  SetFuncDeclaration(this,(FuncDeclaration *)
                          ((long)tVar4.
                                 super__Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>
                                 .super__Head_base<0UL,_wabt::FuncModuleField_*,_false>._M_head_impl
                          + 0x60),&local_78);
  Var::~Var(&local_78);
  local_a0._M_t.
  super__Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>.
  super__Head_base<0UL,_wabt::FuncModuleField_*,_false>._M_head_impl =
       (tuple<wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>)
       (tuple<wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>)
       tVar4.
       super__Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>.
       super__Head_base<0UL,_wabt::FuncModuleField_*,_false>._M_head_impl;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>
                       *)&local_a0);
  if ((_Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>)
      local_a0._M_t.
      super__Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>.
      super__Head_base<0UL,_wabt::FuncModuleField_*,_false>._M_head_impl != (FuncModuleField *)0x0)
  {
    (**(code **)(*(long *)local_a0._M_t.
                          super__Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>
                          .super__Head_base<0UL,_wabt::FuncModuleField_*,_false>._M_head_impl + 8))
              ();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnFunction(Index index, Index sig_index) {
  auto field = MakeUnique<FuncModuleField>(GetLocation());
  Func& func = field->func;
  SetFuncDeclaration(&func.decl, Var(sig_index, GetLocation()));
  module_->AppendField(std::move(field));
  return Result::Ok;
}